

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[10]>,_ProString_&>_>::
     appendTo<QChar>(type *p,QChar **out)

{
  QChar *pQVar1;
  char16_t *pcVar2;
  ProString *pPVar3;
  CutResult CVar4;
  char16_t *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (long)(p->a).a.m_length;
  if (lVar6 != 0) {
    pQVar1 = *out;
    pcVar2 = (p->a).a.m_string.d.ptr;
    local_40 = (long)(p->a).a.m_offset;
    local_48 = lVar6;
    CVar4 = QtPrivate::QContainerImplHelper::mid((p->a).a.m_string.d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar5 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar5,lVar6 * 2);
    *out = *out + lVar6;
  }
  QVar7.m_data = *(p->a).b;
  QVar7.m_size = 9;
  QAbstractConcatenable::convertFromUtf8(QVar7,out);
  pPVar3 = p->b;
  lVar6 = (long)pPVar3->m_length;
  if (lVar6 != 0) {
    pQVar1 = *out;
    pcVar2 = (pPVar3->m_string).d.ptr;
    local_40 = (long)pPVar3->m_offset;
    local_48 = lVar6;
    CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar3->m_string).d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar5 = pcVar2 + local_40;
    }
    memcpy(pQVar1,pcVar5,lVar6 * 2);
    *out = *out + lVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }